

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O2

int Abc_TruthNpnCountUnique(Abc_TtStore_t *p)

{
  int *piVar1;
  size_t __size;
  uint uVar2;
  word **ppwVar3;
  word *pwVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  void *__s_00;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 *puVar17;
  
  uVar2 = p->nFuncs;
  uVar9 = uVar2 - 1;
  do {
    do {
      uVar10 = uVar9 + 1;
      uVar5 = uVar9 & 1;
      uVar9 = uVar10;
    } while (uVar5 != 0);
    uVar8 = 3;
    do {
      iVar6 = (int)uVar8;
      if (uVar10 < (uint)(iVar6 * iVar6)) {
        __size = (long)(int)uVar10 * 4;
        __s = malloc(__size);
        memset(__s,0xff,__size);
        __s_00 = malloc(__size);
        memset(__s_00,0xff,__size);
        uVar8 = 0;
        uVar11 = 0;
        if (0 < (int)uVar2) {
          uVar11 = (ulong)uVar2;
        }
        goto LAB_00298474;
      }
      uVar11 = (ulong)uVar10 % uVar8;
      uVar8 = (ulong)(iVar6 + 2);
    } while ((int)uVar11 != 0);
  } while( true );
LAB_00298474:
  if (uVar8 == uVar11) {
    free(__s);
    free(__s_00);
    if (*p->pFuncs == (word *)0x0) {
      __assert_fail("p->pFuncs[0] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcNpn.c"
                    ,0x6d,"int Abc_TruthNpnCountUnique(Abc_TtStore_t *)");
    }
    iVar6 = 1;
    for (lVar13 = 1; lVar13 < (int)uVar2; lVar13 = lVar13 + 1) {
      pwVar4 = p->pFuncs[lVar13];
      if (pwVar4 != (word *)0x0) {
        lVar16 = (long)iVar6;
        iVar6 = iVar6 + 1;
        p->pFuncs[lVar16] = pwVar4;
      }
    }
    p->nFuncs = iVar6;
    return iVar6;
  }
  ppwVar3 = p->pFuncs;
  uVar9 = p->nWords;
  uVar15 = 0;
  if (0 < (int)uVar9) {
    uVar15 = (ulong)uVar9;
  }
  pwVar4 = ppwVar3[uVar8];
  puVar17 = &Abc_TruthHashKey_s_BigPrimes;
  uVar12 = 0;
  for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    uVar12 = uVar12 + (ulong)(uint)puVar17[(uVar14 / 7) * -7] * pwVar4[uVar14];
    puVar17 = puVar17 + 1;
  }
  piVar1 = (int *)((long)__s + (long)(int)(uVar12 % (ulong)(long)(int)uVar10) * 4);
  piVar7 = piVar1;
  while (lVar13 = (long)*piVar7, lVar13 != -1) {
    iVar6 = bcmp(ppwVar3[lVar13],pwVar4,(long)(int)uVar9 << 3);
    if (iVar6 == 0) {
      ppwVar3[uVar8] = (word *)0x0;
      goto LAB_0029852f;
    }
    piVar7 = (int *)((long)__s_00 + lVar13 * 4);
  }
  *(int *)((long)__s_00 + uVar8 * 4) = *piVar1;
  *piVar1 = (int)uVar8;
LAB_0029852f:
  uVar8 = uVar8 + 1;
  goto LAB_00298474;
}

Assistant:

int Abc_TruthNpnCountUnique( Abc_TtStore_t * p )
{
    // allocate hash table
    int nTableSize = Abc_PrimeCudd(p->nFuncs);
    int * pTable = ABC_FALLOC( int, nTableSize );
    int * pNexts = ABC_FALLOC( int, nTableSize );
    // hash functions
    int i, k, Key;
    for ( i = 0; i < p->nFuncs; i++ )
    {
        Key = Abc_TruthHashKey( p->pFuncs[i], p->nWords, nTableSize );
        if ( Abc_TruthHashLookup( p->pFuncs, i, p->nWords, pTable, pNexts, Key ) ) // found equal
            p->pFuncs[i] = NULL;
        else // there is no equal (the first time this one occurs so far)
            pNexts[i] = pTable[Key], pTable[Key] = i;
    }
    ABC_FREE( pTable );
    ABC_FREE( pNexts );
    // count the number of unqiue functions
    assert( p->pFuncs[0] != NULL );
    for ( i = k = 1; i < p->nFuncs; i++ )
        if ( p->pFuncs[i] != NULL )
            p->pFuncs[k++] = p->pFuncs[i];
    return (p->nFuncs = k);
}